

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_MeshFace::ComputeFaceNormal(ON_MeshFace *this,ON_3fPoint *fV,ON_3dVector *FN)

{
  double dVar1;
  bool bVar2;
  ON_3fVector OVar3;
  ON_3dVector b;
  ON_3dVector a;
  undefined1 local_68 [12];
  undefined4 uStack_5c;
  double local_58;
  undefined1 local_50 [24];
  ON_3dVector local_38;
  
  if (fV != (ON_3fPoint *)0x0) {
    OVar3 = ON_3fPoint::operator-(fV + this->vi[2],fV + this->vi[0]);
    local_50._8_4_ = OVar3.z;
    local_50._0_8_ = OVar3._0_8_;
    ON_3dVector::ON_3dVector(&local_38,(ON_3fVector *)local_50);
    OVar3 = ON_3fPoint::operator-(fV + this->vi[3],fV + this->vi[1]);
    local_68._8_4_ = OVar3.z;
    local_68._0_8_ = OVar3._0_8_;
    ON_3dVector::ON_3dVector((ON_3dVector *)local_50,(ON_3fVector *)local_68);
    ON_CrossProduct((ON_3dVector *)local_68,&local_38,(ON_3dVector *)local_50);
    FN->z = local_58;
    FN->x = (double)local_68._0_8_;
    FN->y = (double)CONCAT44(uStack_5c,local_68._8_4_);
    bVar2 = ON_3dVector::Unitize(FN);
    if (bVar2) {
      return true;
    }
  }
  FN->z = ON_3dVector::ZeroVector.z;
  dVar1 = ON_3dVector::ZeroVector.y;
  FN->x = ON_3dVector::ZeroVector.x;
  FN->y = dVar1;
  return false;
}

Assistant:

bool ON_MeshFace::ComputeFaceNormal( const ON_3fPoint* fV, ON_3dVector& FN ) const
{
  if ( 0 != fV )
  {
    ON_3dVector a = fV[vi[2]] - fV[vi[0]];
    ON_3dVector b = fV[vi[3]] - fV[vi[1]];
    FN = ON_CrossProduct( a, b ); // works for triangles, quads, and nonplanar quads
    if ( FN.Unitize() )
      return true;
  }

  FN = ON_3dVector::ZeroVector;
  return false;
}